

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

size_t prt_state(wchar_t row,wchar_t col)

{
  char cVar1;
  _Bool _Var2;
  ushort uVar3;
  wchar_t wVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  char *fmt;
  char cVar8;
  char local_28 [16];
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  _Var2 = player_is_resting(player);
  if (_Var2) {
    uVar3 = player_resting_count(player);
    my_strcpy(local_28,"Rest      ",0x10);
    if ((short)uVar3 < 1000) {
      cVar8 = (char)uVar3;
      if ((short)uVar3 < 100) {
        if ((short)uVar3 < 10) {
          if ((short)uVar3 < 1) {
            if (uVar3 == 0xfffd) {
              builtin_strncpy(local_28 + 5,"!!!!!",5);
            }
            else if (uVar3 == 0xfffe) {
              builtin_strncpy(local_28 + 5,"&&&&&",5);
            }
            else if (uVar3 == 0xffff) {
              builtin_strncpy(local_28 + 5,"*****",5);
            }
          }
          else {
            local_28[9] = cVar8 + 0x30;
          }
        }
        else {
          cVar1 = (char)(uVar3 / 10);
          local_28[9] = cVar8 + cVar1 * -10 | 0x30;
          local_28[8] = cVar1 + 0x30;
        }
      }
      else {
        cVar1 = (char)(uVar3 / 10);
        local_28[9] = cVar8 + cVar1 * -10 | 0x30;
        local_28[8] = cVar1 + ((byte)((uVar3 / 10) / 5) & 0xfe) * -5 | 0x30;
        local_28[7] = (char)((uVar3 >> 2) / 0x19) + 0x30;
      }
    }
    else {
      uVar6 = (uVar3 >> 2) / 0x19;
      local_28[8] = 0x30;
      local_28[9] = 0x30;
      local_28[7] = (char)uVar6 + ((byte)(uVar6 / 5) & 0xfe) * -5 | 0x30;
      uVar6 = (uVar3 >> 3) / 0x7d;
      local_28[6] = (char)uVar6 + ((byte)(uVar6 / 5) & 0xfe) * -5 | 0x30;
      if (9999 < uVar3) {
        local_28[5] = (byte)((uVar3 >> 4) / 0x271) | 0x30;
      }
    }
  }
  else {
    wVar4 = cmd_get_nrepeats();
    if (wVar4 != L'\0') {
      wVar4 = cmd_get_nrepeats();
      if (wVar4 < L'Ϩ') {
        fmt = "Repeat %3d";
        uVar7 = (ulong)(uint)wVar4;
      }
      else {
        uVar7 = (ulong)(uint)wVar4 / 100;
        fmt = "Rep. %3d00";
      }
      strnfmt(local_28,0x10,fmt,uVar7);
    }
  }
  c_put_str('\x01',local_28,row,col);
  sVar5 = strlen(local_28);
  return sVar5 + 1;
}

Assistant:

static size_t prt_state(int row, int col)
{
	uint8_t attr = COLOUR_WHITE;

	char text[16] = "";


	/* Displayed states are resting and repeating */
	if (player_is_resting(player)) {
		int i;
		int n = player_resting_count(player);

		/* Start with "Rest" */
		my_strcpy(text, "Rest      ", sizeof(text));

		/* Display according to length or intent of rest */
		if (n >= 1000) {
			i = n / 100;
			text[9] = '0';
			text[8] = '0';
			text[7] = I2D(i % 10);
			if (i >= 10) {
				i = i / 10;
				text[6] = I2D(i % 10);
				if (i >= 10)
					text[5] = I2D(i / 10);
			}
		} else if (n >= 100) {
			i = n;
			text[9] = I2D(i % 10);
			i = i / 10;
			text[8] = I2D(i % 10);
			text[7] = I2D(i / 10);
		} else if (n >= 10) {
			i = n;
			text[9] = I2D(i % 10);
			text[8] = I2D(i / 10);
		} else if (n > 0) {
			i = n;
			text[9] = I2D(i);
		} else if (n == REST_ALL_POINTS)
			text[5] = text[6] = text[7] = text[8] = text[9] = '*';
		else if (n == REST_COMPLETE)
			text[5] = text[6] = text[7] = text[8] = text[9] = '&';
		else if (n == REST_SOME_POINTS)
			text[5] = text[6] = text[7] = text[8] = text[9] = '!';

	} else if (cmd_get_nrepeats()) {
		int nrepeats = cmd_get_nrepeats();

		if (nrepeats > 999)
			strnfmt(text, sizeof(text), "Rep. %3d00", nrepeats / 100);
		else
			strnfmt(text, sizeof(text), "Repeat %3d", nrepeats);
	}

	/* Display the info (or blanks) */
	c_put_str(attr, text, row, col);

	return strlen(text) + 1;
}